

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,MMDB_entry_data_list_s *entry_data_list,int indent,int *status)

{
  char *pcVar1;
  uint64_t low;
  uint64_t high;
  char *hex_string;
  char *string;
  uint32_t size_1;
  char *key;
  uint32_t size;
  int *status_local;
  MMDB_entry_data_list_s *pMStack_20;
  int indent_local;
  MMDB_entry_data_list_s *entry_data_list_local;
  FILE *stream_local;
  
  switch((entry_data_list->entry_data).type) {
  case 2:
    pcVar1 = mmdb_strndup((entry_data_list->entry_data).field_1.utf8_string,
                          (ulong)(entry_data_list->entry_data).data_size);
    if (pcVar1 == (char *)0x0) {
      *status = 5;
      return (MMDB_entry_data_list_s *)0x0;
    }
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"\"%s\" <utf8_string>\n",pcVar1);
    free(pcVar1);
    pMStack_20 = entry_data_list->next;
    break;
  case 3:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%f <double>\n",(entry_data_list->entry_data).field_1.utf8_string);
    pMStack_20 = entry_data_list->next;
    break;
  case 4:
    pcVar1 = bytes_to_hex((entry_data_list->entry_data).field_1.bytes,
                          (entry_data_list->entry_data).data_size);
    if (pcVar1 == (char *)0x0) {
      *status = 5;
      return (MMDB_entry_data_list_s *)0x0;
    }
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%s <bytes>\n",pcVar1);
    free(pcVar1);
    pMStack_20 = entry_data_list->next;
    break;
  case 5:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%u <uint16>\n",(ulong)(entry_data_list->entry_data).field_1.uint16);
    pMStack_20 = entry_data_list->next;
    break;
  case 6:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%u <uint32>\n",(ulong)(entry_data_list->entry_data).field_1.pointer);
    pMStack_20 = entry_data_list->next;
    break;
  case 7:
    key._4_4_ = (entry_data_list->entry_data).data_size;
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"{\n");
    pMStack_20 = entry_data_list->next;
    for (; key._4_4_ != 0 && pMStack_20 != (MMDB_entry_data_list_s *)0x0; key._4_4_ = key._4_4_ - 1)
    {
      if ((pMStack_20->entry_data).type != 2) {
        *status = 7;
        return (MMDB_entry_data_list_s *)0x0;
      }
      pcVar1 = mmdb_strndup((pMStack_20->entry_data).field_1.utf8_string,
                            (ulong)(pMStack_20->entry_data).data_size);
      if (pcVar1 == (char *)0x0) {
        *status = 5;
        return (MMDB_entry_data_list_s *)0x0;
      }
      print_indentation(stream,indent + 2);
      fprintf((FILE *)stream,"\"%s\": \n",pcVar1);
      free(pcVar1);
      pMStack_20 = dump_entry_data_list(stream,pMStack_20->next,indent + 4,status);
      if (*status != 0) {
        return (MMDB_entry_data_list_s *)0x0;
      }
    }
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"}\n");
    break;
  case 8:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%d <int32>\n",(ulong)(entry_data_list->entry_data).field_1.pointer);
    pMStack_20 = entry_data_list->next;
    break;
  case 9:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%lu <uint64>\n",(entry_data_list->entry_data).field_1.utf8_string);
    pMStack_20 = entry_data_list->next;
    break;
  case 10:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"0x%016lX%016lX <uint128>\n",
            *(undefined8 *)((long)&(entry_data_list->entry_data).field_1 + 8),
            (entry_data_list->entry_data).field_1.utf8_string);
    pMStack_20 = entry_data_list->next;
    break;
  case 0xb:
    string._4_4_ = (entry_data_list->entry_data).data_size;
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"[\n");
    pMStack_20 = entry_data_list->next;
    for (; string._4_4_ != 0 && pMStack_20 != (MMDB_entry_data_list_s *)0x0;
        string._4_4_ = string._4_4_ - 1) {
      pMStack_20 = dump_entry_data_list(stream,pMStack_20,indent + 2,status);
      if (*status != 0) {
        return (MMDB_entry_data_list_s *)0x0;
      }
    }
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"]\n");
    break;
  default:
    *status = 7;
    return (MMDB_entry_data_list_s *)0x0;
  case 0xe:
    print_indentation(stream,indent);
    pcVar1 = "false";
    if (((entry_data_list->entry_data).field_1.boolean & 1U) != 0) {
      pcVar1 = "true";
    }
    fprintf((FILE *)stream,"%s <boolean>\n",pcVar1);
    pMStack_20 = entry_data_list->next;
    break;
  case 0xf:
    print_indentation(stream,indent);
    fprintf((FILE *)stream,"%f <float>\n",(double)(entry_data_list->entry_data).field_1.float_value)
    ;
    pMStack_20 = entry_data_list->next;
  }
  *status = 0;
  return pMStack_20;
}

Assistant:

static MMDB_entry_data_list_s *
dump_entry_data_list(FILE *stream,
                     MMDB_entry_data_list_s *entry_data_list,
                     int indent,
                     int *status) {
    switch (entry_data_list->entry_data.type) {
        case MMDB_DATA_TYPE_MAP: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "{\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {

                if (MMDB_DATA_TYPE_UTF8_STRING !=
                    entry_data_list->entry_data.type) {
                    *status = MMDB_INVALID_DATA_ERROR;
                    return NULL;
                }
                char *key =
                    mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                 entry_data_list->entry_data.data_size);
                if (NULL == key) {
                    *status = MMDB_OUT_OF_MEMORY_ERROR;
                    return NULL;
                }

                print_indentation(stream, indent);
                fprintf(stream, "\"%s\": \n", key);
                free(key);

                entry_data_list = entry_data_list->next;
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent + 2, status);

                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "}\n");
        } break;
        case MMDB_DATA_TYPE_ARRAY: {
            uint32_t size = entry_data_list->entry_data.data_size;

            print_indentation(stream, indent);
            fprintf(stream, "[\n");
            indent += 2;

            for (entry_data_list = entry_data_list->next;
                 size && entry_data_list;
                 size--) {
                entry_data_list = dump_entry_data_list(
                    stream, entry_data_list, indent, status);
                if (MMDB_SUCCESS != *status) {
                    return NULL;
                }
            }

            indent -= 2;
            print_indentation(stream, indent);
            fprintf(stream, "]\n");
        } break;
        case MMDB_DATA_TYPE_UTF8_STRING: {
            char *string = mmdb_strndup(entry_data_list->entry_data.utf8_string,
                                        entry_data_list->entry_data.data_size);
            if (NULL == string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            print_indentation(stream, indent);
            fprintf(stream, "\"%s\" <utf8_string>\n", string);
            free(string);
            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_BYTES: {
            char *hex_string =
                bytes_to_hex(entry_data_list->entry_data.bytes,
                             entry_data_list->entry_data.data_size);

            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }

            print_indentation(stream, indent);
            fprintf(stream, "%s <bytes>\n", hex_string);
            free(hex_string);

            entry_data_list = entry_data_list->next;
        } break;
        case MMDB_DATA_TYPE_DOUBLE:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <double>\n",
                    entry_data_list->entry_data.double_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_FLOAT:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%f <float>\n",
                    entry_data_list->entry_data.float_value);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT16:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint16>\n", entry_data_list->entry_data.uint16);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT32:
            print_indentation(stream, indent);
            fprintf(
                stream, "%u <uint32>\n", entry_data_list->entry_data.uint32);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_BOOLEAN:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%s <boolean>\n",
                    entry_data_list->entry_data.boolean ? "true" : "false");
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT64:
            print_indentation(stream, indent);
            fprintf(stream,
                    "%" PRIu64 " <uint64>\n",
                    entry_data_list->entry_data.uint64);
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_UINT128:
            print_indentation(stream, indent);
#if MMDB_UINT128_IS_BYTE_ARRAY
            char *hex_string = bytes_to_hex(
                (uint8_t *)entry_data_list->entry_data.uint128, 16);
            if (NULL == hex_string) {
                *status = MMDB_OUT_OF_MEMORY_ERROR;
                return NULL;
            }
            fprintf(stream, "0x%s <uint128>\n", hex_string);
            free(hex_string);
#else
            uint64_t high = entry_data_list->entry_data.uint128 >> 64;
            uint64_t low = (uint64_t)entry_data_list->entry_data.uint128;
            fprintf(stream,
                    "0x%016" PRIX64 "%016" PRIX64 " <uint128>\n",
                    high,
                    low);
#endif
            entry_data_list = entry_data_list->next;
            break;
        case MMDB_DATA_TYPE_INT32:
            print_indentation(stream, indent);
            fprintf(stream, "%d <int32>\n", entry_data_list->entry_data.int32);
            entry_data_list = entry_data_list->next;
            break;
        default:
            *status = MMDB_INVALID_DATA_ERROR;
            return NULL;
    }

    *status = MMDB_SUCCESS;
    return entry_data_list;
}